

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O3

void __thiscall WithEnv::WithEnv(WithEnv *this,string *var,string *val)

{
  pointer pcVar1;
  
  (this->var)._M_dataplus._M_p = (pointer)&(this->var).field_2;
  pcVar1 = (var->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + var->_M_string_length);
  (this->val)._M_dataplus._M_p = (pointer)&(this->val).field_2;
  pcVar1 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->val,pcVar1,pcVar1 + val->_M_string_length);
  setenv((this->var)._M_dataplus._M_p,(this->val)._M_dataplus._M_p,1);
  return;
}

Assistant:

WithEnv(const std::string& var, const std::string& val) : var{var}, val{val} {
    Reset();
  }